

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall
cmFileListGeneratorGlob::cmFileListGeneratorGlob
          (cmFileListGeneratorGlob *this,cmFileListGeneratorGlob *r)

{
  pointer pcVar1;
  
  (this->super_cmFileListGeneratorBase).Next._M_t.
  super___uniq_ptr_impl<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>._M_t
  .super__Tuple_impl<0UL,_cmFileListGeneratorBase_*,_std::default_delete<cmFileListGeneratorBase>_>.
  super__Head_base<0UL,_cmFileListGeneratorBase_*,_false>._M_head_impl =
       (cmFileListGeneratorBase *)0x0;
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorGlob_005f7ee8;
  (this->Pattern)._M_dataplus._M_p = (pointer)&(this->Pattern).field_2;
  pcVar1 = (r->Pattern)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Pattern,pcVar1,pcVar1 + (r->Pattern)._M_string_length);
  return;
}

Assistant:

cmFileListGeneratorGlob(cmFileListGeneratorGlob const& r)
    : Pattern(r.Pattern)
  {
  }